

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:942:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:942:17)>
             *this)

{
  DebugExpression<bool> _kjCondition;
  PromiseCrossThreadFulfillerPair<void> paf;
  WaitScope waitScope;
  StringPtr local_4c8;
  NullableValue<kj::Exception> _e950;
  NullableValue<kj::Exception> local_318;
  EventLoop loop;
  UnixEventPort port;
  
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  newPromiseAndCrossThreadFulfiller<void>();
  _e950.isSet = paf.fulfiller.disposer._0_1_;
  _e950._1_3_ = paf.fulfiller.disposer._1_3_;
  _e950._4_4_ = paf.fulfiller.disposer._4_4_;
  _e950.field_1._0_4_ = paf.fulfiller.ptr._0_4_;
  _e950.field_1._4_4_ = paf.fulfiller.ptr._4_4_;
  paf.fulfiller.ptr = (CrossThreadPromiseFulfiller<void> *)0x0;
  MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_> *)
             &local_318,(this->f).fulfillerMutex);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)
             local_318.field_1.value.ownFile.content.ptr,
             (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&_e950);
  Locked<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_>::~Locked
            ((Locked<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_> *)&local_318)
  ;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&_e950);
  Promise<void>::wait(&paf.promise,&waitScope);
  local_318._0_8_ = local_318._0_8_ & 0xffffffffffffff00;
  kj::_::NullableValue<kj::Exception>::NullableValue(&_e950,&local_318);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_318);
  if (_e950.isSet == true) {
    if (_e950.field_1.value.description.content.size_ == 0) {
      _e950.field_1.value.description.content.ptr = "";
    }
    local_318.field_1.value.ownFile.content.ptr =
         (char *)(_e950.field_1.value.description.content.size_ +
                 (_e950.field_1.value.description.content.size_ == 0));
    local_4c8.content.ptr =
         "cross-thread PromiseFulfiller was destroyed without fulfilling the promise";
    local_4c8.content.size_ = 0x4b;
    local_318._0_8_ = _e950.field_1.value.description.content.ptr;
    _kjCondition.value = StringPtr::contains((StringPtr *)&local_318,&local_4c8);
    if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
      kj::_::Debug::
      log<char_const(&)[123],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
                 ,0x3b6,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"cross-thread PromiseFulfiller was destroyed without fulfilling the promise\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [123])
                  "failed: expected e.getDescription().contains(\"cross-thread PromiseFulfiller was destroyed without fulfilling the promise\")"
                 ,&_kjCondition,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 &_e950.field_1.value);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x3b6,ERROR,"\"code did not throw: \" \"paf.promise.wait(waitScope)\"",
               (char (*) [48])"code did not throw: paf.promise.wait(waitScope)");
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&_e950);
  PromiseCrossThreadFulfillerPair<void>::~PromiseCrossThreadFulfillerPair(&paf);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  UnixEventPort::~UnixEventPort(&port);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }